

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclHash.c
# Opt level: O0

void Tcl_DeleteHashEntry(Tcl_HashEntry *entryPtr)

{
  undefined8 *in_RDI;
  Tcl_HashEntry *prevPtr;
  undefined8 *local_10;
  
  if (*(undefined8 **)in_RDI[2] == in_RDI) {
    *(undefined8 *)in_RDI[2] = *in_RDI;
  }
  else {
    local_10 = *(undefined8 **)in_RDI[2];
    while( true ) {
      if (local_10 == (undefined8 *)0x0) {
        tcl_panic((char *)0x10a7f7);
      }
      if ((undefined8 *)*local_10 == in_RDI) break;
      local_10 = (undefined8 *)*local_10;
    }
    *local_10 = *in_RDI;
  }
  *(int *)(in_RDI[1] + 0x2c) = *(int *)(in_RDI[1] + 0x2c) + -1;
  free(in_RDI);
  return;
}

Assistant:

void
Tcl_DeleteHashEntry(Tcl_HashEntry *entryPtr)
{
    register Tcl_HashEntry *prevPtr;

    if (*entryPtr->bucketPtr == entryPtr) {
	*entryPtr->bucketPtr = entryPtr->nextPtr;
    } else {
	for (prevPtr = *entryPtr->bucketPtr;; prevPtr = prevPtr->nextPtr) {
	    if (prevPtr == NULL) {
		tcl_panic("malformed bucket chain in Tcl_DeleteHashEntry");
	    }
	    if (prevPtr->nextPtr == entryPtr) {
		prevPtr->nextPtr = entryPtr->nextPtr;
		break;
	    }
	}
    }
    entryPtr->tablePtr->numEntries--;
    free((char *) entryPtr);
}